

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.h
# Opt level: O2

string * __thiscall
cfd::api::json::ElementsDecodeRawTransactionTxOut::GetCommitmentnonceString_abi_cxx11_
          (string *__return_storage_ptr__,ElementsDecodeRawTransactionTxOut *this,
          ElementsDecodeRawTransactionTxOut *obj)

{
  core::ConvertToString<std::__cxx11::string>
            (__return_storage_ptr__,(core *)&this->commitmentnonce_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)obj);
  return __return_storage_ptr__;
}

Assistant:

static std::string GetCommitmentnonceString(  // line separate
      const ElementsDecodeRawTransactionTxOut& obj) {  // NOLINT
    return cfd::core::ConvertToString(obj.commitmentnonce_);
  }